

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  bool bVar1;
  int iVar2;
  Classifier CVar3;
  Option *pOVar4;
  ulong uVar5;
  App *this_00;
  string dummy2;
  string dummy1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  iVar2 = ::std::__cxx11::string::compare((char *)current);
  if (iVar2 == 0) {
    CVar3 = POSITIONAL_MARK;
    goto LAB_001418ef;
  }
  bVar1 = _valid_subcommand(this,current,ignore_used_subcommands);
  CVar3 = SUBCOMMAND;
  if (bVar1) goto LAB_001418ef;
  bVar1 = detail::split_long(current,&local_70,&local_90);
  CVar3 = LONG;
  if (bVar1) goto LAB_001418ef;
  bVar1 = detail::split_short(current,&local_70,&local_90);
  if (bVar1) {
    if (((byte)(*local_70._M_dataplus._M_p - 0x30U) < 10) ||
       (((*local_70._M_dataplus._M_p == 0x2e && (local_90._M_string_length != 0)) &&
        ((byte)(*local_90._M_dataplus._M_p - 0x30U) < 10)))) {
      local_50.field_2._M_allocated_capacity._0_2_ =
           (ushort)(byte)*local_70._M_dataplus._M_p << 8 | 0x2d;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pOVar4 = get_option_no_throw(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT53(local_50.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_50.field_2._M_local_buf[2],
                                          local_50.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if (pOVar4 == (Option *)0x0) goto LAB_00141a85;
    }
    CVar3 = SHORT;
  }
  else {
    if (this->allow_windows_style_options_ == true) {
      bVar1 = detail::split_windows_style(current,&local_70,&local_90);
      CVar3 = WINDOWS_STYLE;
      if (bVar1) goto LAB_001418ef;
    }
    iVar2 = ::std::__cxx11::string::compare((char *)current);
    if (((iVar2 == 0) && ((this->name_)._M_string_length != 0)) &&
       (CVar3 = SUBCOMMAND_TERMINATOR, this->parent_ != (App *)0x0)) goto LAB_001418ef;
    uVar5 = ::std::__cxx11::string::find((char)current,0x2e);
    if (uVar5 != 0xffffffffffffffff) {
      ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
      this_00 = _find_subcommand(this,&local_b0,true,ignore_used_subcommands);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (this_00 == (App *)0x0) {
        bVar1 = true;
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
        CVar3 = _recognize(this_00,&local_b0,ignore_used_subcommands);
        uVar5 = (ulong)CVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        bVar1 = CVar3 != SUBCOMMAND;
      }
      CVar3 = (Classifier)uVar5;
      if (!bVar1) goto LAB_001418ef;
    }
LAB_00141a85:
    CVar3 = NONE;
  }
LAB_001418ef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return CVar3;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if((dummy1[0] >= '0' && dummy1[0] <= '9') ||
           (dummy1[0] == '.' && !dummy2.empty() && (dummy2[0] >= '0' && dummy2[0] <= '9'))) {
            // it looks like a number but check if it could be an option
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}